

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetPressureFromThreadP33xx(P33X *pP33x,double *pPressure)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  double *pPressure_local;
  P33X *pP33x_local;
  
  local_24 = 0;
  do {
    if ((P33X *)addrsP33x[local_24] == pP33x) {
      EnterCriticalSection(P33xCS + local_24);
      *pPressure = pressureP33x[local_24];
      iVar1 = resP33x[local_24];
      LeaveCriticalSection(P33xCS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetPressureFromThreadP33xx(P33X* pP33x, double* pPressure)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&P33xCS[id]);
	*pPressure = pressureP33x[id];
	res = resP33x[id];
	LeaveCriticalSection(&P33xCS[id]);

	return res;
}